

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearOneof
          (GeneratedMessageReflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  int key;
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  Type TVar4;
  uint32 uVar5;
  FieldDescriptor *this_00;
  ulong uVar6;
  long *plVar7;
  
  key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_));
  if (key != 0) {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key);
    uVar6 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar6 & 1) != 0) {
      uVar6 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 8);
    }
    if (uVar6 == 0) {
      TVar4 = FieldDescriptor::type(this_00);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
        uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
        plVar7 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 8))();
        }
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 9) {
        if (this_00[0x50] == (FieldDescriptor)0x0) {
          plVar7 = (long *)(*(long *)(this_00 + 0x58) + 0x30);
        }
        else if (*(long *)(this_00 + 0x68) == 0) {
          plVar7 = (long *)(*(long *)(this_00 + 0x30) + 0x98);
        }
        else {
          plVar7 = (long *)(*(long *)(this_00 + 0x68) + 0x80);
        }
        puVar1 = *(undefined8 **)
                  ((long)&(((this->schema_).default_instance_)->super_MessageLite)._vptr_MessageLite
                  + (ulong)(this->schema_).offsets_
                           [(int)((ulong)((long)this_00 - *plVar7) >> 3) * 0x3cf3cf3d]);
        lVar2 = *(long *)(this_00 + 0x60);
        if (lVar2 == 0) {
          SetBit(this,message,this_00);
        }
        else {
          *(undefined4 *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x40)) >> 4) *
                         -0x55555554 + (this->schema_).oneof_case_offset_)) =
               *(undefined4 *)(this_00 + 0x38);
        }
        uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
        uVar6 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                          (ulong)(uint)(this->schema_).metadata_offset_);
        if ((uVar6 & 1) != 0) {
          uVar6 = *(ulong *)((uVar6 & 0xfffffffffffffffe) + 8);
        }
        if ((uVar6 == 0) &&
           (puVar3 = *(undefined8 **)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
           puVar3 != puVar1)) {
          if (puVar3 != (undefined8 *)0x0) {
            if ((long *)*puVar3 != puVar3 + 2) {
              operator_delete((long *)*puVar3,puVar3[2] + 1);
            }
          }
          operator_delete(puVar3,0x20);
        }
      }
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) = 0;
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::ClearOneof(
    Message* message, const OneofDescriptor* oneof_descriptor) const {
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == NULL) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)->
                  Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}